

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::objectivec::ClassName
                   (string *__return_storage_ptr__,Descriptor *descriptor,string *out_suffix_added)

{
  FileDescriptor *this;
  FileDescriptor *file;
  Descriptor *descriptor_00;
  allocator<char> local_b1;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_60 [8];
  string name;
  string prefix;
  string *out_suffix_added_local;
  Descriptor *descriptor_local;
  
  this = Descriptor::file(descriptor);
  FileClassPrefix_abi_cxx11_((string *)((long)&name.field_2 + 8),(objectivec *)this,file);
  ClassNameWorker_abi_cxx11_((string *)local_60,(objectivec *)descriptor,descriptor_00);
  std::operator+(&local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&name.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"_Class",&local_b1);
  anon_unknown_0::SanitizeNameForObjC(__return_storage_ptr__,&local_90,&local_b0,out_suffix_added);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

string ClassName(const Descriptor* descriptor, string* out_suffix_added) {
  // 1. Message names are used as is (style calls for CamelCase, trust it).
  // 2. Check for reserved word at the very end and then suffix things.
  string prefix = FileClassPrefix(descriptor->file());
  string name = ClassNameWorker(descriptor);
  return SanitizeNameForObjC(prefix + name, "_Class", out_suffix_added);
}